

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_BigFourWinds_Test::~TEST_DoublingFactorCounterTest_BigFourWinds_Test
          (TEST_DoublingFactorCounterTest_BigFourWinds_Test *this)

{
  TEST_DoublingFactorCounterTest_BigFourWinds_Test *mem;
  TEST_DoublingFactorCounterTest_BigFourWinds_Test *this_local;
  
  mem = this;
  ~TEST_DoublingFactorCounterTest_BigFourWinds_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, BigFourWinds)
{
	addPair(Tile::OneOfBamboos);
	addTriplet(Tile::EastWind, false);
	addTriplet(Tile::SouthWind, false);
	addTriplet(Tile::WestWind, false);
	addTriplet(Tile::NorthWind, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::BigFourWinds));
	CHECK_EQUAL(100, r.doubling_factor);
}